

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O2

bool __thiscall cmWorkerPoolInternal::Process(cmWorkerPoolInternal *this)

{
  int iVar1;
  cmWorkerPoolInternal *__n;
  void *__buf;
  _Head_base<0UL,_uv_loop_s_*,_false> ctx;
  int in_R8D;
  
  this->Processing = true;
  this->Aborting = false;
  ::cm::uv_async_ptr::init
            (&this->UVRequestBegin,
             (EVP_PKEY_CTX *)
             (this->UVLoop)._M_t.super___uniq_ptr_impl<uv_loop_s,_std::default_delete<uv_loop_s>_>.
             _M_t.super__Tuple_impl<0UL,_uv_loop_s_*,_std::default_delete<uv_loop_s>_>.
             super__Head_base<0UL,_uv_loop_s_*,_false>._M_head_impl);
  ctx._M_head_impl =
       (this->UVLoop)._M_t.super___uniq_ptr_impl<uv_loop_s,_std::default_delete<uv_loop_s>_>._M_t.
       super__Tuple_impl<0UL,_uv_loop_s_*,_std::default_delete<uv_loop_s>_>.
       super__Head_base<0UL,_uv_loop_s_*,_false>._M_head_impl;
  __n = this;
  ::cm::uv_async_ptr::init(&this->UVRequestEnd,(EVP_PKEY_CTX *)ctx._M_head_impl);
  ::cm::uv_async_ptr::send(&this->UVRequestBegin,(int)ctx._M_head_impl,__buf,(size_t)__n,in_R8D);
  iVar1 = uv_run((this->UVLoop)._M_t.
                 super___uniq_ptr_impl<uv_loop_s,_std::default_delete<uv_loop_s>_>._M_t.
                 super__Tuple_impl<0UL,_uv_loop_s_*,_std::default_delete<uv_loop_s>_>.
                 super__Head_base<0UL,_uv_loop_s_*,_false>._M_head_impl,UV_RUN_DEFAULT);
  this->Processing = false;
  this->Aborting = false;
  return iVar1 == 0;
}

Assistant:

bool cmWorkerPoolInternal::Process()
{
  // Reset state flags
  Processing = true;
  Aborting = false;
  // Initialize libuv asynchronous request
  UVRequestBegin.init(*UVLoop, &cmWorkerPoolInternal::UVSlotBegin, this);
  UVRequestEnd.init(*UVLoop, &cmWorkerPoolInternal::UVSlotEnd, this);
  // Send begin request
  UVRequestBegin.send();
  // Run libuv loop
  bool success = (uv_run(UVLoop.get(), UV_RUN_DEFAULT) == 0);
  // Update state flags
  Processing = false;
  Aborting = false;
  return success;
}